

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_key.cpp
# Opt level: O1

bool make_entry(value *val,string *type,string *algo,string *file,int bytes)

{
  uint uVar1;
  pointer pcVar2;
  string *psVar3;
  copyable *pcVar4;
  ostream *poVar5;
  bool bVar6;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream f;
  value vStack_2b8;
  string local_2b0;
  value local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  value local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230;
  filebuf local_228 [8];
  undefined1 local_220 [16];
  uint auStack_210 [54];
  ios_base local_138 [264];
  
  cppcms::json::value::value<std::__cxx11::string>(local_290,algo);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"session","");
  psVar3 = (string *)cppcms::json::value::operator[]((string *)val);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"client","");
  psVar3 = (string *)cppcms::json::value::operator[](psVar3);
  pcVar4 = (copyable *)cppcms::json::value::operator[](psVar3);
  cppcms::json::value::copyable::operator=(pcVar4,&local_290[0].d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  cppcms::json::value::copyable::~copyable(&local_290[0].d);
  make_key_abi_cxx11_(&local_2b0,bytes);
  if (file->_M_string_length == 0) {
    cppcms::json::value::value<std::__cxx11::string>(local_250,&local_2b0);
    local_230 = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"session","");
    psVar3 = (string *)cppcms::json::value::operator[]((string *)val);
    local_290[0] = (value)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"client","");
    psVar3 = (string *)cppcms::json::value::operator[](psVar3);
    pcVar2 = (type->_M_dataplus)._M_p;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,pcVar2,pcVar2 + type->_M_string_length);
    std::__cxx11::string::append((char *)local_270);
    pcVar4 = (copyable *)cppcms::json::value::operator[](psVar3);
    cppcms::json::value::copyable::operator=(pcVar4,&local_250[0].d);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    if (local_290[0] != (value)local_280) {
      operator_delete((void *)local_290[0]);
    }
    if (local_230 != local_220) {
      operator_delete(local_230);
    }
    cppcms::json::value::copyable::~copyable(&local_250[0].d);
  }
  else {
    std::ofstream::ofstream(&local_230,(file->_M_dataplus)._M_p,_S_out);
    uVar1 = *(uint *)((long)auStack_210 + *(long *)(local_230 + -0x18));
    if ((uVar1 & 5) == 0) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,local_2b0._M_dataplus._M_p,
                          local_2b0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::ofstream::close();
      cppcms::json::value::value<std::__cxx11::string>(&vStack_2b8,file);
      local_290[0] = (value)local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"session","");
      psVar3 = (string *)cppcms::json::value::operator[]((string *)val);
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"client","");
      psVar3 = (string *)cppcms::json::value::operator[](psVar3);
      pcVar2 = (type->_M_dataplus)._M_p;
      local_250[0] = (value)local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_250,pcVar2,pcVar2 + type->_M_string_length);
      std::__cxx11::string::append((char *)local_250);
      pcVar4 = (copyable *)cppcms::json::value::operator[](psVar3);
      cppcms::json::value::copyable::operator=(pcVar4,&vStack_2b8.d);
      if (local_250[0] != (value)local_240) {
        operator_delete((void *)local_250[0]);
      }
      if (local_270[0] != local_260) {
        operator_delete(local_270[0]);
      }
      if (local_290[0] != (value)local_280) {
        operator_delete((void *)local_290[0]);
      }
      cppcms::json::value::copyable::~copyable(&vStack_2b8.d);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to open file ",0x14);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _urandom_device;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    if ((uVar1 & 5) != 0) {
      bVar6 = false;
      goto LAB_00102911;
    }
  }
  bVar6 = true;
LAB_00102911:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  return bVar6;
}

Assistant:

bool make_entry(cppcms::json::value &val,std::string type,std::string algo,std::string file,int bytes)
{
	val["session"]["client"][type]=algo;
	std::string key=make_key(bytes);
	if(!file.empty()) {
		std::ofstream f(file.c_str());
		if(!f) {
			std::cerr << "Failed to open file " << file << std::endl;
			return false;
		}
		f << key << std::endl;
		f.close();
		val["session"]["client"][type +"_key_file"]=file;
	}
	else {
		val["session"]["client"][type+"_key"] = key;
	}
	return true;
}